

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O2

string * __thiscall
flatbuffers::FlatBufService::name_abi_cxx11_(string *__return_storage_ptr__,FlatBufService *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this->service_);
  return __return_storage_ptr__;
}

Assistant:

std::string name() const { return service_->name; }